

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer_combination_iterator.h
# Opt level: O1

void __thiscall
Gudhi::coxeter_triangulation::Integer_combination_iterator::
Integer_combination_iterator<Gudhi::coxeter_triangulation::Size_range<std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
          (Integer_combination_iterator *this,uint *n,uint *k,
          Size_range<std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          *bounds)

{
  uint uVar1;
  pointer pvVar2;
  pointer pvVar3;
  iterator iVar4;
  uint *puVar5;
  pointer puVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  pointer pvVar11;
  unsigned_long b;
  long lVar12;
  bool bVar13;
  allocator_type local_59;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_58;
  uint local_4c [3];
  uint *local_40;
  uint *local_38;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->value_,(ulong)(*k + 2),&local_59);
  uVar1 = *k;
  this->is_end_ = uVar1 == 0 || *n == 0;
  this->k_ = uVar1;
  local_58 = &this->bounds_;
  (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(local_58,(ulong)(*k + 2));
  pvVar2 = (bounds->t_->
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (bounds->t_->
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar13 = pvVar2 == pvVar3;
  local_40 = k;
  local_38 = n;
  if (bVar13) {
    uVar10 = 0;
  }
  else {
    lVar12 = ((long)(pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start >> 3) + -1;
    uVar10 = 0;
    do {
      pvVar11 = pvVar2 + 1;
      uVar7 = (uint)lVar12;
      iVar4._M_current =
           (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_4c[2] = uVar7;
      if (iVar4._M_current ==
          (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (local_58,iVar4,local_4c + 2);
      }
      else {
        *iVar4._M_current = uVar7;
        (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      if (pvVar11 == pvVar3) {
        bVar13 = true;
      }
      else {
        lVar12 = ((long)pvVar2[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)(pvVar11->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                        ._M_impl.super__Vector_impl_data._M_start >> 3) + -1;
      }
      uVar10 = uVar10 + uVar7;
      pvVar2 = pvVar11;
    } while (!bVar13);
  }
  local_4c[1] = 2;
  iVar4._M_current =
       (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (local_58,iVar4,local_4c + 1);
  }
  else {
    *iVar4._M_current = 2;
    (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  puVar5 = local_38;
  local_4c[0] = 1;
  iVar4._M_current =
       (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (local_58,iVar4,local_4c);
  }
  else {
    *iVar4._M_current = 1;
    (this->bounds_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  uVar7 = *puVar5;
  if (uVar10 < uVar7) {
    this->is_end_ = true;
  }
  else {
    puVar5 = (local_58->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = *puVar5;
    if (uVar7 < uVar10) {
      uVar9 = 1;
      uVar8 = 0;
    }
    else {
      puVar6 = (this->value_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar9 = 1;
      uVar8 = 0;
      do {
        puVar6[uVar8] = uVar10;
        uVar7 = uVar7 - puVar5[uVar8];
        uVar8 = (ulong)uVar9;
        uVar10 = puVar5[uVar8];
        uVar9 = uVar9 + 1;
      } while (uVar10 <= uVar7);
    }
    puVar6 = (this->value_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar6[uVar8] = uVar7;
    if (uVar9 < this->k_) {
      uVar8 = (ulong)uVar9;
      do {
        puVar6[uVar8] = 0;
        uVar8 = uVar8 + 1;
      } while (uVar8 < this->k_);
    }
    puVar6[*local_40] = 1;
    puVar6[*local_40 + 1] = 0;
  }
  return;
}

Assistant:

Integer_combination_iterator(const uint& n, const uint& k, const Bound_range& bounds)
	  : value_(k + 2), is_end_(n == 0 || k == 0), k_(k) {
    bounds_.reserve(k + 2);
    uint sum_radices = 0;
    for (auto b : bounds) {
      bounds_.push_back(b);
      sum_radices += b;
    }
    bounds_.push_back(2);
    bounds_.push_back(1);
    if (n > sum_radices) {
      is_end_ = true;
      return;
    }
    uint i = 0;
    uint s = n;
    while (s >= bounds_[i]) {
      value_[i] = bounds_[i];
      s -= bounds_[i];
      i++;
    }
    value_[i++] = s;

    while (i < k_) value_[i++] = 0;
    value_[k] = 1;
    value_[k + 1] = 0;
  }